

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_findFrameCompressedSize(void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  ulong in_RSI;
  long in_RDI;
  size_t cBlockSize;
  blockProperties_t blockProperties;
  size_t ret;
  ZSTD_frameHeader zfh;
  size_t remainingSize;
  BYTE *ipstart;
  BYTE *ip;
  blockProperties_t *in_stack_ffffffffffffff88;
  ZSTD_frameHeader *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_40;
  int local_38;
  undefined1 *local_30;
  byte *local_20;
  blockProperties_t *local_8;
  
  if ((in_RSI < 8) ||
     (UVar1 = MEM_readLE32(in_stack_ffffffffffffff88), (UVar1 & 0xfffffff0) != 0x184d2a50)) {
    local_8 = (blockProperties_t *)
              ZSTD_getFrameHeader(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x1fedba);
    uVar2 = ERR_isError((size_t)local_8);
    if (uVar2 == 0) {
      if (local_8 == (blockProperties_t *)0x0) {
        local_20 = (byte *)(in_RDI + (ulong)local_40);
        local_30 = (undefined1 *)(in_RSI - local_40);
        while( true ) {
          in_stack_ffffffffffffff88 =
               (blockProperties_t *)
               ZSTD_getcBlockSize((void *)CONCAT44(in_stack_ffffffffffffff9c,
                                                   in_stack_ffffffffffffff98),
                                  (size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          uVar2 = ERR_isError((size_t)in_stack_ffffffffffffff88);
          local_8 = in_stack_ffffffffffffff88;
          if (uVar2 != 0) break;
          if (local_30 < (byte *)((long)&in_stack_ffffffffffffff88->blockType + 3U)) {
            return 0xffffffffffffffb8;
          }
          local_20 = (byte *)((long)&in_stack_ffffffffffffff88->blockType + 3) + (long)local_20;
          local_30 = local_30 + -(long)((long)&in_stack_ffffffffffffff88->blockType + 3);
          if (in_stack_ffffffffffffff98 != 0) {
            if (local_38 != 0) {
              if (local_30 < (undefined1 *)0x4) {
                return 0xffffffffffffffb8;
              }
              local_20 = local_20 + 4;
            }
            return (size_t)(local_20 + -in_RDI);
          }
          in_stack_ffffffffffffff98 = 0;
        }
      }
      else {
        local_8 = (blockProperties_t *)0xffffffffffffffb8;
      }
    }
  }
  else {
    UVar1 = MEM_readLE32(in_stack_ffffffffffffff88);
    local_8 = (blockProperties_t *)((ulong)UVar1 + 8);
  }
  return (size_t)local_8;
}

Assistant:

size_t ZSTD_findFrameCompressedSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
#endif
    if ( (srcSize >= ZSTD_skippableHeaderSize)
      && (MEM_readLE32(src) & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START ) {
        return ZSTD_skippableHeaderSize + MEM_readLE32((const BYTE*)src + ZSTD_frameIdSize);
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret)) return ret;
            if (ret > 0) return ERROR(srcSize_wrong);
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Loop on each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ERROR(srcSize_wrong);

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;

            if (blockProperties.lastBlock) break;
        }

        if (zfh.checksumFlag) {   /* Final frame content checksum */
            if (remainingSize < 4) return ERROR(srcSize_wrong);
            ip += 4;
            remainingSize -= 4;
        }

        return ip - ipstart;
    }
}